

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

Token * __thiscall llvm::yaml::Node::getNext(Token *__return_storage_ptr__,Node *this)

{
  Scanner::getNext(__return_storage_ptr__,
                   *(Scanner **)
                    &((this->Doc->_M_t).
                      super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                      .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)->stream->
                     scanner);
  return __return_storage_ptr__;
}

Assistant:

Token Node::getNext() {
  return Doc->getNext();
}